

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

void uv::TCPClient::AfterConnect(uv_connect_t *handle,int status)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ILog4zManager *pIVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  long *in_FS_OFFSET;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  lVar2 = *(long *)((long)handle->handle->data + 0x1d8);
  if (status == 0) {
    iVar7 = uv_read_start(handle->handle,AllocBufferForRecv,AfterRecv);
    if (iVar7 == 0) {
      *(undefined4 *)(lVar2 + 0x450) = 1;
      lVar3 = *in_FS_OFFSET;
      puVar1 = (undefined8 *)(lVar3 + -0x800);
      *puVar1 = 0x28746e65696c63;
      pcVar11 = (char *)(lVar3 + -0x7f9);
      uVar5 = snprintf(pcVar11,0x7f9,"%016llx",lVar2);
      uVar4 = 0;
      if ((int)uVar5 < 0) {
LAB_0011a13f:
        uVar5 = uVar4;
        *pcVar11 = '\0';
      }
      else if (0x7f8 < (int)uVar5) {
        pcVar11 = (char *)(lVar3 + -1);
        uVar4 = 0x7f9;
        goto LAB_0011a13f;
      }
      uVar9 = (ulong)(uVar5 + 7);
      if (uVar5 < 0x7f9) {
        pcVar11 = (char *)((long)puVar1 + uVar9);
        iVar10 = 0x800 - (uVar5 + 7);
        iVar6 = snprintf(pcVar11,(long)iVar10,"%s",")run");
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_0011a18d:
          iVar6 = iVar7;
          *pcVar11 = '\0';
        }
        else if (iVar10 <= iVar6) {
          pcVar11 = (char *)(lVar3 + -1);
          iVar7 = iVar10;
          goto LAB_0011a18d;
        }
        uVar9 = uVar9 + (long)iVar6;
      }
      if ((long)uVar9 < 0x800) {
        pcVar11 = (char *)((long)puVar1 + uVar9);
        iVar10 = 0x800 - (int)uVar9;
        iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ( ");
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_0011a1de:
          iVar6 = iVar7;
          *pcVar11 = '\0';
        }
        else if (iVar10 <= iVar6) {
          pcVar11 = (char *)(lVar3 + -1);
          iVar7 = iVar10;
          goto LAB_0011a1de;
        }
        uVar9 = uVar9 + (long)iVar6;
      }
      if ((long)uVar9 < 0x800) {
        pcVar11 = (char *)((long)puVar1 + uVar9);
        iVar10 = 0x800 - (int)uVar9;
        iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ");
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_0011a22f:
          iVar6 = iVar7;
          *pcVar11 = '\0';
        }
        else if (iVar10 <= iVar6) {
          pcVar11 = (char *)(lVar3 + -1);
          iVar7 = iVar10;
          goto LAB_0011a22f;
        }
        uVar9 = uVar9 + (long)iVar6;
      }
      if ((long)uVar9 < 0x800) {
        pcVar11 = (char *)((long)puVar1 + uVar9);
        iVar10 = 0x800 - (int)uVar9;
        iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ) : ");
        iVar7 = 0;
        if (iVar6 < 0) {
LAB_0011a280:
          iVar6 = iVar7;
          *pcVar11 = '\0';
        }
        else if (iVar10 <= iVar6) {
          pcVar11 = (char *)(lVar3 + -1);
          iVar7 = iVar10;
          goto LAB_0011a280;
        }
        uVar9 = uVar9 + (long)iVar6;
      }
      if ((long)uVar9 < 0x800) {
        pcVar11 = (char *)((long)puVar1 + uVar9);
        iVar6 = 0x800 - (int)uVar9;
        iVar7 = snprintf(pcVar11,(long)iVar6,"%d",0x122);
        if (-1 < iVar7) {
          if (iVar7 < iVar6) goto LAB_0011a2d1;
          pcVar11 = (char *)(lVar3 + -1);
        }
        *pcVar11 = '\0';
      }
LAB_0011a2d1:
      pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,1,puVar1);
      goto LAB_0011a2ee;
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::operator=((string *)(lVar2 + 0x5c0),(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    lVar3 = *in_FS_OFFSET;
    puVar1 = (undefined8 *)(lVar3 + -0x800);
    *puVar1 = 0x28746e65696c63;
    pcVar11 = (char *)(lVar3 + -0x7f9);
    uVar5 = snprintf(pcVar11,0x7f9,"%016llx",lVar2);
    uVar4 = 0;
    if ((int)uVar5 < 0) {
LAB_00119e7f:
      uVar5 = uVar4;
      *pcVar11 = '\0';
    }
    else if (0x7f8 < (int)uVar5) {
      pcVar11 = (char *)(lVar3 + -1);
      uVar4 = 0x7f9;
      goto LAB_00119e7f;
    }
    uVar9 = (ulong)(uVar5 + 7);
    if (uVar5 < 0x7f9) {
      pcVar11 = (char *)((long)puVar1 + uVar9);
      iVar10 = 0x800 - (uVar5 + 7);
      iVar6 = snprintf(pcVar11,(long)iVar10,"%s",") uv_read_start error:");
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00119ecd:
        iVar6 = iVar7;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar6) {
        pcVar11 = (char *)(lVar3 + -1);
        iVar7 = iVar10;
        goto LAB_00119ecd;
      }
      uVar9 = uVar9 + (long)iVar6;
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,*(long *)(lVar2 + 0x5c0),
               *(long *)(lVar2 + 0x5c8) + *(long *)(lVar2 + 0x5c0));
    if ((long)uVar9 < 0x800) {
      pcVar11 = (char *)((long)puVar1 + uVar9);
      iVar10 = 0x800 - (int)uVar9;
      iVar6 = snprintf(pcVar11,(long)iVar10,"%s",local_70[0]);
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00119f41:
        iVar6 = iVar7;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar6) {
        pcVar11 = (char *)(lVar3 + -1);
        iVar7 = iVar10;
        goto LAB_00119f41;
      }
      uVar9 = uVar9 + (long)iVar6;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if ((long)uVar9 < 0x800) {
      pcVar11 = (char *)((long)puVar1 + uVar9);
      iVar10 = 0x800 - (int)uVar9;
      iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ( ");
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00119fa9:
        iVar6 = iVar7;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar6) {
        pcVar11 = (char *)(lVar3 + -1);
        iVar7 = iVar10;
        goto LAB_00119fa9;
      }
      uVar9 = uVar9 + (long)iVar6;
    }
    if ((long)uVar9 < 0x800) {
      pcVar11 = (char *)((long)puVar1 + uVar9);
      iVar10 = 0x800 - (int)uVar9;
      iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ");
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_00119ffa:
        iVar6 = iVar7;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar6) {
        pcVar11 = (char *)(lVar3 + -1);
        iVar7 = iVar10;
        goto LAB_00119ffa;
      }
      uVar9 = uVar9 + (long)iVar6;
    }
    if ((long)uVar9 < 0x800) {
      pcVar11 = (char *)((long)puVar1 + uVar9);
      iVar10 = 0x800 - (int)uVar9;
      iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ) : ");
      iVar7 = 0;
      if (iVar6 < 0) {
LAB_0011a04b:
        iVar6 = iVar7;
        *pcVar11 = '\0';
      }
      else if (iVar10 <= iVar6) {
        pcVar11 = (char *)(lVar3 + -1);
        iVar7 = iVar10;
        goto LAB_0011a04b;
      }
      uVar9 = uVar9 + (long)iVar6;
    }
    if ((long)uVar9 < 0x800) {
      pcVar11 = (char *)((long)puVar1 + uVar9);
      iVar6 = 0x800 - (int)uVar9;
      iVar7 = snprintf(pcVar11,(long)iVar6,"%d",0x11d);
      if (-1 < iVar7) {
        if (iVar7 < iVar6) goto LAB_0011a09c;
        pcVar11 = (char *)(lVar3 + -1);
      }
      *pcVar11 = '\0';
    }
LAB_0011a09c:
    pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,3,puVar1);
    fprintf(_stdout,"uv_read_start error:%s\n",*(undefined8 *)(lVar2 + 0x5c0));
    *(undefined4 *)(lVar2 + 0x450) = 2;
LAB_0011a2ee:
    if (*(char *)(lVar2 + 0x588) != '\x01') {
      return;
    }
    fwrite("reconnect succeed\n",0x12,1,_stdout);
    *(undefined1 *)(lVar2 + 0x588) = 0;
    *(undefined8 *)*(undefined8 *)(lVar2 + 8) = *(undefined8 *)(lVar2 + 8);
    *(undefined8 *)(lVar2 + 0x590) = 1000;
    uv_timer_stop(lVar2 + 0x4f0);
    if (*(code **)(lVar2 + 0x4e0) == (code *)0x0) {
      return;
    }
    (**(code **)(lVar2 + 0x4e0))(0,*(undefined8 *)(lVar2 + 0x4e8));
    return;
  }
  *(undefined4 *)(lVar2 + 0x450) = 2;
  GetUVError_abi_cxx11_(&local_90,status);
  std::__cxx11::string::operator=((string *)(lVar2 + 0x5c0),(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  lVar3 = *in_FS_OFFSET;
  puVar1 = (undefined8 *)(lVar3 + -0x800);
  *puVar1 = 0x28746e65696c63;
  pcVar11 = (char *)(lVar3 + -0x7f9);
  uVar5 = snprintf(pcVar11,0x7f9,"%016llx",lVar2);
  uVar4 = 0;
  if ((int)uVar5 < 0) {
LAB_00119b3d:
    uVar5 = uVar4;
    *pcVar11 = '\0';
  }
  else if (0x7f8 < (int)uVar5) {
    pcVar11 = (char *)(lVar3 + -1);
    uVar4 = 0x7f9;
    goto LAB_00119b3d;
  }
  uVar9 = (ulong)(uVar5 + 7);
  if (uVar5 < 0x7f9) {
    pcVar11 = (char *)((long)puVar1 + uVar9);
    iVar10 = 0x800 - (uVar5 + 7);
    iVar6 = snprintf(pcVar11,(long)iVar10,"%s",") connect error:");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00119b8b:
      *pcVar11 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar10 <= iVar6) {
        pcVar11 = (char *)(lVar3 + -1);
        iVar7 = iVar10;
        goto LAB_00119b8b;
      }
    }
    uVar9 = uVar9 + (long)iVar7;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)(lVar2 + 0x5c0),
             *(long *)(lVar2 + 0x5c8) + *(long *)(lVar2 + 0x5c0));
  if ((long)uVar9 < 0x800) {
    pcVar11 = (char *)((long)puVar1 + uVar9);
    iVar10 = 0x800 - (int)uVar9;
    iVar6 = snprintf(pcVar11,(long)iVar10,"%s",local_50[0]);
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00119bff:
      iVar6 = iVar7;
      *pcVar11 = '\0';
    }
    else if (iVar10 <= iVar6) {
      pcVar11 = (char *)(lVar3 + -1);
      iVar7 = iVar10;
      goto LAB_00119bff;
    }
    uVar9 = uVar9 + (long)iVar6;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((long)uVar9 < 0x800) {
    pcVar11 = (char *)((long)puVar1 + uVar9);
    iVar10 = 0x800 - (int)uVar9;
    iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ( ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00119c67:
      iVar6 = iVar7;
      *pcVar11 = '\0';
    }
    else if (iVar10 <= iVar6) {
      pcVar11 = (char *)(lVar3 + -1);
      iVar7 = iVar10;
      goto LAB_00119c67;
    }
    uVar9 = uVar9 + (long)iVar6;
  }
  if ((long)uVar9 < 0x800) {
    pcVar11 = (char *)((long)puVar1 + uVar9);
    iVar10 = 0x800 - (int)uVar9;
    iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00119cb8:
      iVar6 = iVar7;
      *pcVar11 = '\0';
    }
    else if (iVar10 <= iVar6) {
      pcVar11 = (char *)(lVar3 + -1);
      iVar7 = iVar10;
      goto LAB_00119cb8;
    }
    uVar9 = uVar9 + (long)iVar6;
  }
  if ((long)uVar9 < 0x800) {
    pcVar11 = (char *)((long)puVar1 + uVar9);
    iVar10 = 0x800 - (int)uVar9;
    iVar6 = snprintf(pcVar11,(long)iVar10,"%s"," ) : ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_00119d09:
      iVar6 = iVar7;
      *pcVar11 = '\0';
    }
    else if (iVar10 <= iVar6) {
      pcVar11 = (char *)(lVar3 + -1);
      iVar7 = iVar10;
      goto LAB_00119d09;
    }
    uVar9 = uVar9 + (long)iVar6;
  }
  if ((long)uVar9 < 0x800) {
    pcVar11 = (char *)((long)puVar1 + uVar9);
    iVar6 = 0x800 - (int)uVar9;
    iVar7 = snprintf(pcVar11,(long)iVar6,"%d",0x110);
    if (-1 < iVar7) {
      if (iVar7 < iVar6) goto LAB_00119d5a;
      pcVar11 = (char *)(lVar3 + -1);
    }
    *pcVar11 = '\0';
  }
LAB_00119d5a:
  pIVar8 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar8->_vptr_ILog4zManager[8])(pIVar8,0,3,puVar1);
  fprintf(_stdout,"connect error:%s\n",*(undefined8 *)(lVar2 + 0x5c0));
  if (*(char *)(lVar2 + 0x588) == '\x01') {
    uv_timer_stop(lVar2 + 0x4f0);
    lVar3 = *(long *)(lVar2 + 0x590) * 2;
    *(long *)(lVar2 + 0x590) = lVar3;
    uv_timer_start(lVar2 + 0x4f0,ReconnectTimer,lVar3);
  }
  return;
}

Assistant:

void TCPClient::AfterConnect(uv_connect_t* handle, int status)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->handle->data;
    TCPClient* parent = (TCPClient*)theclass->parent_server;
    if (status) {
        parent->connectstatus_ = CONNECT_ERROR;
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") connect error:" << parent->errmsg_);
        fprintf(stdout, "connect error:%s\n", parent->errmsg_.c_str());
        if (parent->isreconnecting_) {//reconnect failure, restart timer to trigger reconnect.
            uv_timer_stop(&parent->reconnect_timer_);
            parent->repeat_time_ *= 2;
            uv_timer_start(&parent->reconnect_timer_, TCPClient::ReconnectTimer, parent->repeat_time_, parent->repeat_time_);
        }
        return;
    }

    int iret = uv_read_start(handle->handle, AllocBufferForRecv, AfterRecv);
    if (iret) {
        parent->errmsg_ = GetUVError(status);
        LOGE("client(" << parent << ") uv_read_start error:" << parent->errmsg_);
        fprintf(stdout, "uv_read_start error:%s\n", parent->errmsg_.c_str());
        parent->connectstatus_ = CONNECT_ERROR;
    } else {
        parent->connectstatus_ = CONNECT_FINISH;
        LOGI("client(" << parent << ")run");
    }
    if (parent->isreconnecting_) {
        fprintf(stdout, "reconnect succeed\n");
        parent->StopReconnect();//reconnect succeed.
        if (parent->reconnectcb_) {
            parent->reconnectcb_(NET_EVENT_TYPE_RECONNECT, parent->reconnect_userdata_);
        }
    }
}